

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeLockTable(Btree *p,int iTab,u8 isWriteLock)

{
  char in_DL;
  Pgno in_ESI;
  Btree *in_RDI;
  u8 lockType;
  int rc;
  undefined3 in_stack_00000008;
  int local_14;
  
  local_14 = 0;
  if (in_RDI->sharable != '\0') {
    sqlite3BtreeEnter((Btree *)0x18d2cc);
    local_14 = querySharedCacheTableLock(in_RDI,in_ESI,in_DL + '\x01');
    if (local_14 == 0) {
      local_14 = setSharedCacheTableLock((Btree *)CONCAT44(iTab,_in_stack_00000008),rc,lockType);
    }
    sqlite3BtreeLeave((Btree *)0x18d30b);
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeLockTable(Btree *p, int iTab, u8 isWriteLock){
  int rc = SQLITE_OK;
  assert( p->inTrans!=TRANS_NONE );
  if( p->sharable ){
    u8 lockType = READ_LOCK + isWriteLock;
    assert( READ_LOCK+1==WRITE_LOCK );
    assert( isWriteLock==0 || isWriteLock==1 );

    sqlite3BtreeEnter(p);
    rc = querySharedCacheTableLock(p, iTab, lockType);
    if( rc==SQLITE_OK ){
      rc = setSharedCacheTableLock(p, iTab, lockType);
    }
    sqlite3BtreeLeave(p);
  }
  return rc;
}